

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

void __thiscall implementations::scheme::SchemeFrame::setExpression(SchemeFrame *this,cell *value)

{
  bool bVar1;
  const_iterator cVar2;
  undefined1 local_70 [8];
  cell val;
  cell *value_local;
  SchemeFrame *this_local;
  
  this->resolved = false;
  val.env.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value;
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::clear
            (&this->arguments);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::clear
            (&this->resolved_arguments);
  cell::cell((cell *)local_70,
             (cell *)val.env.
                     super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
  bVar1 = resolveExpression(this,(cell *)local_70);
  if (bVar1) {
    cVar2 = std::
            vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
            cbegin(&this->arguments);
    (this->arg_it)._M_current = cVar2._M_current;
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    clear(&this->resolved_arguments);
    this->resolved = true;
  }
  else {
    cVar2 = std::
            vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
            cbegin(&this->arguments);
    (this->arg_it)._M_current = cVar2._M_current;
    nextArgument(this);
  }
  cell::~cell((cell *)local_70);
  return;
}

Assistant:

void setExpression(const cell &value) {
		DEBUG("setExpression(" + to_string(value) + ")");
		resolved = false;
		arguments.clear();
		resolved_arguments.clear();
		cell val(value);
		if (resolveExpression(val)) {
			arg_it = arguments.cbegin();
			resolved_arguments.clear();
			resolved = true;
			return;
		}
		arg_it = arguments.cbegin();
		nextArgument();
	}